

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

bool embree::avx::BVHNIntersector1<4,_1,_true,_embree::avx::SubGridIntersector1Pluecker<4,_true>_>::
     pointQuery(Intersectors *This,PointQuery *query,PointQueryContext *context)

{
  ulong *puVar1;
  float fVar2;
  float fVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  Geometry *this;
  long lVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 (*pauVar17) [16];
  bool bVar18;
  bool bVar19;
  uint uVar20;
  byte bVar21;
  ulong uVar22;
  ulong uVar23;
  undefined4 uVar24;
  undefined8 unaff_R14;
  long lVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [64];
  undefined1 auVar62 [16];
  undefined1 auVar63 [64];
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 local_1038 [8];
  float fStack_1030;
  float fStack_102c;
  undefined1 local_1028 [16];
  undefined1 (*local_1010) [16];
  long local_1008;
  long local_1000;
  undefined1 local_ff8 [16];
  undefined1 local_fe8 [16];
  float local_fd8;
  float fStack_fd4;
  float fStack_fd0;
  float fStack_fcc;
  undefined1 local_fc8 [16];
  float local_fb8;
  float fStack_fb4;
  float fStack_fb0;
  float fStack_fac;
  undefined1 local_fa8 [16];
  undefined1 local_f98 [16];
  undefined1 local_f88 [16];
  long local_f78;
  undefined4 uStack_f70;
  undefined1 local_f68 [3896];
  
  local_f78 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_f78 == 8) {
    return false;
  }
  uStack_f70 = 0;
  if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
    local_1028 = ZEXT416((uint)(query->radius * query->radius));
  }
  else {
    aVar4 = (context->query_radius).field_0;
    local_1028 = vdpps_avx((undefined1  [16])aVar4,(undefined1  [16])aVar4,0x7f);
  }
  local_1010 = (undefined1 (*) [16])local_f68;
  uVar24 = *(undefined4 *)&(query->p).field_0;
  local_f98._4_4_ = uVar24;
  local_f98._0_4_ = uVar24;
  local_f98._8_4_ = uVar24;
  local_f98._12_4_ = uVar24;
  auVar61 = ZEXT1664(local_f98);
  fVar2 = (query->p).field_0.field_0.y;
  auVar54._4_4_ = fVar2;
  auVar54._0_4_ = fVar2;
  auVar54._8_4_ = fVar2;
  auVar54._12_4_ = fVar2;
  fVar3 = (query->p).field_0.field_0.z;
  auVar50._4_4_ = fVar3;
  auVar50._0_4_ = fVar3;
  auVar50._8_4_ = fVar3;
  auVar50._12_4_ = fVar3;
  uVar24 = *(undefined4 *)&(context->query_radius).field_0;
  auVar26._4_4_ = uVar24;
  auVar26._0_4_ = uVar24;
  auVar26._8_4_ = uVar24;
  auVar26._12_4_ = uVar24;
  uVar24 = *(undefined4 *)((long)&(context->query_radius).field_0 + 4);
  auVar30._4_4_ = uVar24;
  auVar30._0_4_ = uVar24;
  auVar30._8_4_ = uVar24;
  auVar30._12_4_ = uVar24;
  uVar24 = *(undefined4 *)((long)&(context->query_radius).field_0 + 8);
  auVar36._4_4_ = uVar24;
  auVar36._0_4_ = uVar24;
  auVar36._8_4_ = uVar24;
  auVar36._12_4_ = uVar24;
  bVar19 = false;
  do {
    local_fa8 = vsubps_avx(auVar61._0_16_,auVar26);
    fVar9 = auVar26._0_4_;
    fVar10 = auVar26._4_4_;
    fVar11 = auVar26._8_4_;
    fVar12 = auVar26._12_4_;
    local_fb8 = auVar61._0_4_ + fVar9;
    fStack_fb4 = auVar61._4_4_ + fVar10;
    fStack_fb0 = auVar61._8_4_ + fVar11;
    fStack_fac = auVar61._12_4_ + fVar12;
    local_fc8 = vsubps_avx(auVar54,auVar30);
    local_fd8 = fVar2 + auVar30._0_4_;
    fStack_fd4 = fVar2 + auVar30._4_4_;
    fStack_fd0 = fVar2 + auVar30._8_4_;
    fStack_fcc = fVar2 + auVar30._12_4_;
    local_fe8 = vsubps_avx(auVar50,auVar36);
    local_ff8._0_4_ = fVar3 + auVar36._0_4_;
    local_ff8._4_4_ = fVar3 + auVar36._4_4_;
    local_ff8._8_4_ = fVar3 + auVar36._8_4_;
    local_ff8._12_4_ = fVar3 + auVar36._12_4_;
    local_f88._0_4_ = fVar9 * fVar9;
    local_f88._4_4_ = fVar10 * fVar10;
    local_f88._8_4_ = fVar11 * fVar11;
    local_f88._12_4_ = fVar12 * fVar12;
    auVar63 = ZEXT1664(local_f88);
LAB_00b93f60:
    do {
      do {
        if (local_1010 == (undefined1 (*) [16])&local_f78) {
          return bVar19;
        }
        pauVar17 = local_1010 + -1;
        local_1010 = local_1010 + -1;
      } while ((float)local_1028._0_4_ < *(float *)(*pauVar17 + 8));
      uVar22 = *(ulong *)*local_1010;
LAB_00b93f7e:
      auVar26 = auVar61._0_16_;
      if (context->query_type != POINT_QUERY_TYPE_SPHERE) {
        if ((uVar22 & 8) != 0) goto LAB_00b9429b;
        auVar30 = *(undefined1 (*) [16])(uVar22 + 0x20);
        auVar36 = *(undefined1 (*) [16])(uVar22 + 0x30);
        auVar14 = vmaxps_avx(auVar26,auVar30);
        auVar14 = vminps_avx(auVar14,auVar36);
        auVar14 = vsubps_avx(auVar14,auVar26);
        auVar26 = vmaxps_avx(auVar54,*(undefined1 (*) [16])(uVar22 + 0x40));
        auVar26 = vminps_avx(auVar26,*(undefined1 (*) [16])(uVar22 + 0x50));
        auVar13 = vsubps_avx(auVar26,auVar54);
        auVar26 = vmaxps_avx(auVar50,*(undefined1 (*) [16])(uVar22 + 0x60));
        auVar26 = vminps_avx(auVar26,*(undefined1 (*) [16])(uVar22 + 0x70));
        auVar26 = vsubps_avx(auVar26,auVar50);
        local_1038._4_4_ =
             auVar14._4_4_ * auVar14._4_4_ + auVar13._4_4_ * auVar13._4_4_ +
             auVar26._4_4_ * auVar26._4_4_;
        local_1038._0_4_ =
             auVar14._0_4_ * auVar14._0_4_ + auVar13._0_4_ * auVar13._0_4_ +
             auVar26._0_4_ * auVar26._0_4_;
        fStack_1030 = auVar14._8_4_ * auVar14._8_4_ + auVar13._8_4_ * auVar13._8_4_ +
                      auVar26._8_4_ * auVar26._8_4_;
        fStack_102c = auVar14._12_4_ * auVar14._12_4_ + auVar13._12_4_ * auVar13._12_4_ +
                      auVar26._12_4_ * auVar26._12_4_;
        auVar26 = vcmpps_avx(auVar30,auVar36,2);
        auVar14 = vcmpps_avx(*(undefined1 (*) [16])(uVar22 + 0x50),local_fc8,5);
        auVar26 = vandps_avx(auVar26,auVar14);
        auVar13._4_4_ = fStack_fb4;
        auVar13._0_4_ = local_fb8;
        auVar13._8_4_ = fStack_fb0;
        auVar13._12_4_ = fStack_fac;
        auVar30 = vcmpps_avx(auVar30,auVar13,2);
        auVar14._4_4_ = fStack_fd4;
        auVar14._0_4_ = local_fd8;
        auVar14._8_4_ = fStack_fd0;
        auVar14._12_4_ = fStack_fcc;
        auVar14 = vcmpps_avx(*(undefined1 (*) [16])(uVar22 + 0x40),auVar14,2);
        auVar30 = vandps_avx(auVar14,auVar30);
        auVar14 = vcmpps_avx(*(undefined1 (*) [16])(uVar22 + 0x70),local_fe8,5);
        auVar26 = vandps_avx(auVar26,auVar14);
        auVar36 = vcmpps_avx(auVar36,local_fa8,5);
        auVar14 = vcmpps_avx(*(undefined1 (*) [16])(uVar22 + 0x60),local_ff8,2);
        auVar36 = vandps_avx(auVar14,auVar36);
        auVar30 = vandps_avx(auVar30,auVar36);
        auVar26 = vandps_avx(auVar30,auVar26);
LAB_00b93ff4:
        auVar26 = vpslld_avx(auVar26,0x1f);
        uVar20 = vmovmskps_avx(auVar26);
        if (uVar20 != 0) {
          uVar20 = uVar20 & 0xff;
          uVar23 = uVar22 & 0xfffffffffffffff0;
          lVar25 = 0;
          if (uVar20 != 0) {
            for (; (uVar20 >> lVar25 & 1) == 0; lVar25 = lVar25 + 1) {
            }
          }
          uVar22 = *(ulong *)(uVar23 + lVar25 * 8);
          uVar20 = uVar20 - 1 & uVar20;
          if (uVar20 != 0) {
            uVar5 = *(uint *)(local_1038 + lVar25 * 4);
            lVar25 = 0;
            if (uVar20 != 0) {
              for (; (uVar20 >> lVar25 & 1) == 0; lVar25 = lVar25 + 1) {
              }
            }
            uVar7 = *(ulong *)(uVar23 + lVar25 * 8);
            uVar6 = *(uint *)(local_1038 + lVar25 * 4);
            uVar20 = uVar20 - 1 & uVar20;
            if (uVar20 == 0) {
              if (uVar5 < uVar6) {
                *(ulong *)*local_1010 = uVar7;
                *(uint *)(*local_1010 + 8) = uVar6;
                local_1010 = local_1010 + 1;
              }
              else {
                *(ulong *)*local_1010 = uVar22;
                *(uint *)(*local_1010 + 8) = uVar5;
                local_1010 = local_1010 + 1;
                uVar22 = uVar7;
              }
            }
            else {
              auVar27._8_8_ = 0;
              auVar27._0_8_ = uVar22;
              auVar26 = vpunpcklqdq_avx(auVar27,ZEXT416(uVar5));
              auVar31._8_8_ = 0;
              auVar31._0_8_ = uVar7;
              auVar30 = vpunpcklqdq_avx(auVar31,ZEXT416(uVar6));
              lVar25 = 0;
              if (uVar20 != 0) {
                for (; (uVar20 >> lVar25 & 1) == 0; lVar25 = lVar25 + 1) {
                }
              }
              auVar37._8_8_ = 0;
              auVar37._0_8_ = *(ulong *)(uVar23 + lVar25 * 8);
              auVar14 = vpunpcklqdq_avx(auVar37,ZEXT416(*(uint *)(local_1038 + lVar25 * 4)));
              auVar36 = vpcmpgtd_avx(auVar30,auVar26);
              uVar20 = uVar20 - 1 & uVar20;
              if (uVar20 == 0) {
                auVar13 = vpshufd_avx(auVar36,0xaa);
                auVar36 = vblendvps_avx(auVar30,auVar26,auVar13);
                auVar26 = vblendvps_avx(auVar26,auVar30,auVar13);
                auVar30 = vpcmpgtd_avx(auVar14,auVar36);
                auVar13 = vpshufd_avx(auVar30,0xaa);
                auVar30 = vblendvps_avx(auVar14,auVar36,auVar13);
                auVar36 = vblendvps_avx(auVar36,auVar14,auVar13);
                auVar14 = vpcmpgtd_avx(auVar36,auVar26);
                auVar13 = vpshufd_avx(auVar14,0xaa);
                auVar14 = vblendvps_avx(auVar36,auVar26,auVar13);
                auVar26 = vblendvps_avx(auVar26,auVar36,auVar13);
                *local_1010 = auVar26;
                local_1010[1] = auVar14;
                uVar22 = auVar30._0_8_;
                local_1010 = local_1010 + 2;
              }
              else {
                lVar25 = 0;
                if (uVar20 != 0) {
                  for (; (uVar20 >> lVar25 & 1) == 0; lVar25 = lVar25 + 1) {
                  }
                }
                auVar43._8_8_ = 0;
                auVar43._0_8_ = *(ulong *)(uVar23 + lVar25 * 8);
                auVar27 = vpunpcklqdq_avx(auVar43,ZEXT416(*(uint *)(local_1038 + lVar25 * 4)));
                auVar13 = vpshufd_avx(auVar36,0xaa);
                auVar36 = vblendvps_avx(auVar30,auVar26,auVar13);
                auVar26 = vblendvps_avx(auVar26,auVar30,auVar13);
                auVar30 = vpcmpgtd_avx(auVar27,auVar14);
                auVar13 = vpshufd_avx(auVar30,0xaa);
                auVar30 = vblendvps_avx(auVar27,auVar14,auVar13);
                auVar14 = vblendvps_avx(auVar14,auVar27,auVar13);
                auVar13 = vpcmpgtd_avx(auVar14,auVar26);
                auVar27 = vpshufd_avx(auVar13,0xaa);
                auVar13 = vblendvps_avx(auVar14,auVar26,auVar27);
                auVar26 = vblendvps_avx(auVar26,auVar14,auVar27);
                auVar14 = vpcmpgtd_avx(auVar30,auVar36);
                auVar27 = vpshufd_avx(auVar14,0xaa);
                auVar14 = vblendvps_avx(auVar30,auVar36,auVar27);
                auVar30 = vblendvps_avx(auVar36,auVar30,auVar27);
                auVar36 = vpcmpgtd_avx(auVar13,auVar30);
                auVar27 = vpshufd_avx(auVar36,0xaa);
                auVar36 = vblendvps_avx(auVar13,auVar30,auVar27);
                auVar30 = vblendvps_avx(auVar30,auVar13,auVar27);
                *local_1010 = auVar26;
                local_1010[1] = auVar30;
                local_1010[2] = auVar36;
                uVar22 = auVar14._0_8_;
                local_1010 = local_1010 + 3;
              }
            }
          }
          goto LAB_00b93f7e;
        }
        goto LAB_00b93f60;
      }
      if ((uVar22 & 8) == 0) {
        auVar30 = vmaxps_avx(auVar26,*(undefined1 (*) [16])(uVar22 + 0x20));
        auVar36 = vminps_avx(auVar30,*(undefined1 (*) [16])(uVar22 + 0x30));
        auVar30 = vmaxps_avx(auVar54,*(undefined1 (*) [16])(uVar22 + 0x40));
        auVar30 = vminps_avx(auVar30,*(undefined1 (*) [16])(uVar22 + 0x50));
        auVar36 = vsubps_avx(auVar36,auVar26);
        auVar30 = vsubps_avx(auVar30,auVar54);
        auVar26 = vmaxps_avx(auVar50,*(undefined1 (*) [16])(uVar22 + 0x60));
        auVar26 = vminps_avx(auVar26,*(undefined1 (*) [16])(uVar22 + 0x70));
        auVar26 = vsubps_avx(auVar26,auVar50);
        local_1038._0_4_ =
             auVar36._0_4_ * auVar36._0_4_ + auVar30._0_4_ * auVar30._0_4_ +
             auVar26._0_4_ * auVar26._0_4_;
        local_1038._4_4_ =
             auVar36._4_4_ * auVar36._4_4_ + auVar30._4_4_ * auVar30._4_4_ +
             auVar26._4_4_ * auVar26._4_4_;
        fStack_1030 = auVar36._8_4_ * auVar36._8_4_ + auVar30._8_4_ * auVar30._8_4_ +
                      auVar26._8_4_ * auVar26._8_4_;
        fStack_102c = auVar36._12_4_ * auVar36._12_4_ + auVar30._12_4_ * auVar30._12_4_ +
                      auVar26._12_4_ * auVar26._12_4_;
        auVar26 = vcmpps_avx(_local_1038,auVar63._0_16_,2);
        auVar30 = vcmpps_avx(*(undefined1 (*) [16])(uVar22 + 0x20),
                             *(undefined1 (*) [16])(uVar22 + 0x30),2);
        auVar26 = vandps_avx(auVar26,auVar30);
        goto LAB_00b93ff4;
      }
LAB_00b9429b:
      local_1008 = (ulong)((uint)uVar22 & 0xf) - 8;
      bVar21 = 0;
      for (local_1000 = 0; local_1000 != local_1008; local_1000 = local_1000 + 1) {
        puVar1 = (ulong *)((uVar22 & 0xfffffffffffffff0) + 0x20 + local_1000 * 0x58);
        if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
          fVar9 = *(float *)(puVar1 + 3);
          fVar10 = *(float *)((long)puVar1 + 0x24);
          auVar28._8_8_ = 0;
          auVar28._0_8_ = *puVar1;
          auVar26 = vpmovzxbd_avx(auVar28);
          auVar26 = vcvtdq2ps_avx(auVar26);
          auVar32._0_4_ = fVar9 + fVar10 * auVar26._0_4_;
          auVar32._4_4_ = fVar9 + fVar10 * auVar26._4_4_;
          auVar32._8_4_ = fVar9 + fVar10 * auVar26._8_4_;
          auVar32._12_4_ = fVar9 + fVar10 * auVar26._12_4_;
          auVar38._8_8_ = 0;
          auVar38._0_8_ = *(ulong *)((long)puVar1 + 4);
          auVar26 = vpmovzxbd_avx(auVar38);
          auVar26 = vcvtdq2ps_avx(auVar26);
          auVar41._0_4_ = fVar9 + fVar10 * auVar26._0_4_;
          auVar41._4_4_ = fVar9 + fVar10 * auVar26._4_4_;
          auVar41._8_4_ = fVar9 + fVar10 * auVar26._8_4_;
          auVar41._12_4_ = fVar9 + fVar10 * auVar26._12_4_;
          fVar9 = *(float *)((long)puVar1 + 0x1c);
          fVar10 = *(float *)(puVar1 + 5);
          auVar51._8_8_ = 0;
          auVar51._0_8_ = puVar1[1];
          auVar26 = vpmovzxbd_avx(auVar51);
          auVar26 = vcvtdq2ps_avx(auVar26);
          auVar52._0_4_ = fVar9 + fVar10 * auVar26._0_4_;
          auVar52._4_4_ = fVar9 + fVar10 * auVar26._4_4_;
          auVar52._8_4_ = fVar9 + fVar10 * auVar26._8_4_;
          auVar52._12_4_ = fVar9 + fVar10 * auVar26._12_4_;
          auVar55._8_8_ = 0;
          auVar55._0_8_ = *(ulong *)((long)puVar1 + 0xc);
          auVar26 = vpmovzxbd_avx(auVar55);
          auVar26 = vcvtdq2ps_avx(auVar26);
          auVar44._0_4_ = fVar9 + fVar10 * auVar26._0_4_;
          auVar44._4_4_ = fVar9 + fVar10 * auVar26._4_4_;
          auVar44._8_4_ = fVar9 + fVar10 * auVar26._8_4_;
          auVar44._12_4_ = fVar9 + fVar10 * auVar26._12_4_;
          fVar9 = *(float *)(puVar1 + 4);
          fVar10 = *(float *)((long)puVar1 + 0x2c);
          auVar58._8_8_ = 0;
          auVar58._0_8_ = puVar1[2];
          auVar26 = vpmovzxbd_avx(auVar58);
          auVar26 = vcvtdq2ps_avx(auVar26);
          auVar59._0_4_ = auVar26._0_4_ * fVar10 + fVar9;
          auVar59._4_4_ = auVar26._4_4_ * fVar10 + fVar9;
          auVar59._8_4_ = auVar26._8_4_ * fVar10 + fVar9;
          auVar59._12_4_ = auVar26._12_4_ * fVar10 + fVar9;
          auVar62._8_8_ = 0;
          auVar62._0_8_ = *(ulong *)((long)puVar1 + 0x14);
          auVar26 = vpmovzxbd_avx(auVar62);
          auVar26 = vcvtdq2ps_avx(auVar26);
          auVar47._0_4_ = fVar9 + auVar26._0_4_ * fVar10;
          auVar47._4_4_ = fVar9 + auVar26._4_4_ * fVar10;
          auVar47._8_4_ = fVar9 + auVar26._8_4_ * fVar10;
          auVar47._12_4_ = fVar9 + auVar26._12_4_ * fVar10;
          auVar26 = vmaxps_avx(local_f98,auVar32);
          auVar26 = vminps_avx(auVar26,auVar41);
          auVar30 = vsubps_avx(auVar26,local_f98);
          auVar26 = vmaxps_avx(auVar54,auVar52);
          auVar26 = vminps_avx(auVar26,auVar44);
          auVar36 = vsubps_avx(auVar26,auVar54);
          auVar26 = vmaxps_avx(auVar50,auVar59);
          auVar26 = vminps_avx(auVar26,auVar47);
          auVar26 = vsubps_avx(auVar26,auVar50);
          auVar45._0_4_ =
               auVar30._0_4_ * auVar30._0_4_ + auVar36._0_4_ * auVar36._0_4_ +
               auVar26._0_4_ * auVar26._0_4_;
          auVar45._4_4_ =
               auVar30._4_4_ * auVar30._4_4_ + auVar36._4_4_ * auVar36._4_4_ +
               auVar26._4_4_ * auVar26._4_4_;
          auVar45._8_4_ =
               auVar30._8_4_ * auVar30._8_4_ + auVar36._8_4_ * auVar36._8_4_ +
               auVar26._8_4_ * auVar26._8_4_;
          auVar45._12_4_ =
               auVar30._12_4_ * auVar30._12_4_ + auVar36._12_4_ * auVar36._12_4_ +
               auVar26._12_4_ * auVar26._12_4_;
          auVar30 = vcmpps_avx(auVar45,auVar63._0_16_,2);
          auVar26 = vcmpps_avx(auVar32,auVar41,2);
          auVar36 = vpminub_avx(auVar28,auVar38);
          auVar29._8_8_ = 0;
          auVar29._0_8_ = *puVar1;
          auVar36 = vpcmpeqb_avx(auVar29,auVar36);
          auVar36 = vpmovsxbd_avx(auVar36);
          auVar26 = vandps_avx(auVar26,auVar36);
          auVar26 = vandps_avx(auVar26,auVar30);
        }
        else {
          auVar33._8_8_ = 0;
          auVar33._0_8_ = *puVar1;
          auVar39._8_8_ = 0;
          auVar39._0_8_ = *(ulong *)((long)puVar1 + 4);
          auVar26 = vpminub_avx(auVar33,auVar39);
          auVar26 = vpcmpeqb_avx(auVar33,auVar26);
          auVar36 = vpmovsxbd_avx(auVar26);
          fVar9 = *(float *)(puVar1 + 3);
          fVar10 = *(float *)((long)puVar1 + 0x24);
          auVar34._8_8_ = 0;
          auVar34._0_8_ = *puVar1;
          auVar26 = vpmovzxbd_avx(auVar34);
          auVar26 = vcvtdq2ps_avx(auVar26);
          auVar35._0_4_ = fVar9 + fVar10 * auVar26._0_4_;
          auVar35._4_4_ = fVar9 + fVar10 * auVar26._4_4_;
          auVar35._8_4_ = fVar9 + fVar10 * auVar26._8_4_;
          auVar35._12_4_ = fVar9 + fVar10 * auVar26._12_4_;
          auVar26 = vpmovzxbd_avx(auVar39);
          auVar26 = vcvtdq2ps_avx(auVar26);
          auVar40._0_4_ = fVar9 + fVar10 * auVar26._0_4_;
          auVar40._4_4_ = fVar9 + fVar10 * auVar26._4_4_;
          auVar40._8_4_ = fVar9 + fVar10 * auVar26._8_4_;
          auVar40._12_4_ = fVar9 + fVar10 * auVar26._12_4_;
          fVar9 = *(float *)((long)puVar1 + 0x1c);
          fVar10 = *(float *)(puVar1 + 5);
          auVar48._8_8_ = 0;
          auVar48._0_8_ = puVar1[1];
          auVar26 = vpmovzxbd_avx(auVar48);
          auVar26 = vcvtdq2ps_avx(auVar26);
          auVar49._0_4_ = fVar9 + fVar10 * auVar26._0_4_;
          auVar49._4_4_ = fVar9 + fVar10 * auVar26._4_4_;
          auVar49._8_4_ = fVar9 + fVar10 * auVar26._8_4_;
          auVar49._12_4_ = fVar9 + fVar10 * auVar26._12_4_;
          auVar53._8_8_ = 0;
          auVar53._0_8_ = *(ulong *)((long)puVar1 + 0xc);
          auVar26 = vpmovzxbd_avx(auVar53);
          auVar26 = vcvtdq2ps_avx(auVar26);
          auVar42._0_4_ = fVar9 + fVar10 * auVar26._0_4_;
          auVar42._4_4_ = fVar9 + fVar10 * auVar26._4_4_;
          auVar42._8_4_ = fVar9 + fVar10 * auVar26._8_4_;
          auVar42._12_4_ = fVar9 + fVar10 * auVar26._12_4_;
          fVar9 = *(float *)(puVar1 + 4);
          fVar10 = *(float *)((long)puVar1 + 0x2c);
          auVar56._8_8_ = 0;
          auVar56._0_8_ = puVar1[2];
          auVar26 = vpmovzxbd_avx(auVar56);
          auVar26 = vcvtdq2ps_avx(auVar26);
          auVar57._0_4_ = fVar9 + fVar10 * auVar26._0_4_;
          auVar57._4_4_ = fVar9 + fVar10 * auVar26._4_4_;
          auVar57._8_4_ = fVar9 + fVar10 * auVar26._8_4_;
          auVar57._12_4_ = fVar9 + fVar10 * auVar26._12_4_;
          auVar60._8_8_ = 0;
          auVar60._0_8_ = *(ulong *)((long)puVar1 + 0x14);
          auVar26 = vpmovzxbd_avx(auVar60);
          auVar26 = vcvtdq2ps_avx(auVar26);
          auVar46._0_4_ = fVar9 + auVar26._0_4_ * fVar10;
          auVar46._4_4_ = fVar9 + auVar26._4_4_ * fVar10;
          auVar46._8_4_ = fVar9 + auVar26._8_4_ * fVar10;
          auVar46._12_4_ = fVar9 + auVar26._12_4_ * fVar10;
          auVar26 = vcmpps_avx(auVar35,auVar40,2);
          auVar30 = vcmpps_avx(auVar40,local_fa8,5);
          auVar26 = vandps_avx(auVar30,auVar26);
          auVar16._4_4_ = fStack_fb4;
          auVar16._0_4_ = local_fb8;
          auVar16._8_4_ = fStack_fb0;
          auVar16._12_4_ = fStack_fac;
          auVar30 = vcmpps_avx(auVar35,auVar16,2);
          auVar30 = vandps_avx(auVar30,auVar36);
          auVar26 = vandps_avx(auVar30,auVar26);
          auVar30 = vcmpps_avx(auVar42,local_fc8,5);
          auVar15._4_4_ = fStack_fd4;
          auVar15._0_4_ = local_fd8;
          auVar15._8_4_ = fStack_fd0;
          auVar15._12_4_ = fStack_fcc;
          auVar36 = vcmpps_avx(auVar49,auVar15,2);
          auVar30 = vandps_avx(auVar36,auVar30);
          auVar36 = vcmpps_avx(auVar46,local_fe8,5);
          auVar14 = vcmpps_avx(auVar57,local_ff8,2);
          auVar30 = vandps_avx(auVar30,auVar14);
          auVar26 = vandps_avx(auVar26,auVar30);
          auVar26 = vandps_avx(auVar26,auVar36);
        }
        auVar26 = vpslld_avx(auVar26,0x1f);
        uVar24 = vmovmskps_avx(auVar26);
        lVar25 = local_1000 * 0x58 + (uVar22 & 0xfffffffffffffff0);
        for (uVar23 = CONCAT44((int)((ulong)unaff_R14 >> 0x20),uVar24); uVar23 != 0;
            uVar23 = uVar23 & uVar23 - 1) {
          lVar8 = 0;
          if (uVar23 != 0) {
            for (; (uVar23 >> lVar8 & 1) == 0; lVar8 = lVar8 + 1) {
            }
          }
          uVar20 = *(uint *)(lVar25 + 0x50);
          uVar5 = *(uint *)(lVar25 + 4 + lVar8 * 8);
          this = (context->scene->geometries).items[uVar20].ptr;
          context->geomID = uVar20;
          context->primID = uVar5;
          bVar18 = Geometry::pointQuery(this,query,context);
          auVar63 = ZEXT1664(local_f88);
          bVar21 = bVar21 | bVar18;
        }
        auVar61 = ZEXT1664(local_f98);
        unaff_R14 = 0;
      }
    } while (bVar21 == 0);
    uVar24 = *(undefined4 *)&(context->query_radius).field_0;
    auVar26._4_4_ = uVar24;
    auVar26._0_4_ = uVar24;
    auVar26._8_4_ = uVar24;
    auVar26._12_4_ = uVar24;
    uVar24 = *(undefined4 *)((long)&(context->query_radius).field_0 + 4);
    auVar30._4_4_ = uVar24;
    auVar30._0_4_ = uVar24;
    auVar30._8_4_ = uVar24;
    auVar30._12_4_ = uVar24;
    uVar24 = *(undefined4 *)((long)&(context->query_radius).field_0 + 8);
    auVar36._4_4_ = uVar24;
    auVar36._0_4_ = uVar24;
    auVar36._8_4_ = uVar24;
    auVar36._12_4_ = uVar24;
    if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
      local_1028 = ZEXT416((uint)(query->radius * query->radius));
    }
    else {
      aVar4 = (context->query_radius).field_0;
      local_1028 = vdpps_avx((undefined1  [16])aVar4,(undefined1  [16])aVar4,0x7f);
    }
    bVar19 = true;
  } while( true );
}

Assistant:

static __forceinline bool pointQuery(const Accel::Intersectors* This, PointQuery* query, PointQueryContext* context)
      {
        const BVH* __restrict__ bvh = (const BVH*)This->ptr;
        
        /* we may traverse an empty BVH in case all geometry was invalid */
        if (bvh->root == BVH::emptyNode)
          return false;
        
        /* stack state */
        StackItemT<NodeRef> stack[stackSize];    // stack of nodes
        StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
        StackItemT<NodeRef>* stackEnd = stack+stackSize;
        stack[0].ptr  = bvh->root;
        stack[0].dist = neg_inf;
        
        /* verify correct input */
        assert(!(types & BVH_MB) || (query->time >= 0.0f && query->time <= 1.0f));

        /* load the point query into SIMD registers */
        TravPointQuery<N> tquery(query->p, context->query_radius);

        /* initialize the node traverser */
        BVHNNodeTraverser1Hit<N,types> nodeTraverser;

        bool changed = false;
        float cull_radius = context->query_type == POINT_QUERY_TYPE_SPHERE
                          ? query->radius * query->radius
                          : dot(context->query_radius, context->query_radius);

        /* pop loop */
        while (true) pop:
        {
          /* pop next node */
          if (unlikely(stackPtr == stack)) break;
          stackPtr--;
          NodeRef cur = NodeRef(stackPtr->ptr);

          /* if popped node is too far, pop next one */
          if (unlikely(*(float*)&stackPtr->dist > cull_radius))
            continue;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(point_query.trav_nodes,1,1,1);
            bool nodeIntersected;
            if (likely(context->query_type == POINT_QUERY_TYPE_SPHERE)) {
              nodeIntersected = BVHNNodePointQuerySphere1<N, types>::pointQuery(cur, tquery, query->time, tNear, mask);
            } else {
              nodeIntersected = BVHNNodePointQueryAABB1  <N, types>::pointQuery(cur, tquery, query->time, tNear, mask);
            }
            if (unlikely(!nodeIntersected)) { STAT3(point_query.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(point_query.trav_leaves,1,1,1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
          size_t lazy_node = 0;
          if (PrimitiveIntersector1::pointQuery(This, query, context, prim, num, tquery, lazy_node))
          {
            changed = true;
            tquery.rad = context->query_radius;
            cull_radius = context->query_type == POINT_QUERY_TYPE_SPHERE
                        ? query->radius * query->radius
                        : dot(context->query_radius, context->query_radius);
          }

          /* push lazy node onto stack */
          if (unlikely(lazy_node)) {
            stackPtr->ptr = lazy_node;
            stackPtr->dist = neg_inf;
            stackPtr++;
          }
        }
        return changed;
      }